

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFStream.cpp
# Opt level: O2

void __thiscall PDFStream::FlushStreamContentForDirectExtentStream(PDFStream *this)

{
  OutputStreamTraits streamCopier;
  InputStringBufferStream inputStreamForWrite;
  string local_30 [32];
  
  (**(code **)(*(long *)&this->mTemporaryStream + 0x20))(&this->mTemporaryStream,0,0,0x18);
  InputStringBufferStream::InputStringBufferStream(&inputStreamForWrite,&this->mTemporaryStream);
  OutputStreamTraits::OutputStreamTraits(&streamCopier,&this->mOutputStream->super_IByteWriter);
  OutputStreamTraits::CopyToOutputStream(&streamCopier,(IByteReader *)&inputStreamForWrite);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_30);
  this->mOutputStream = (IByteWriterWithPosition *)0x0;
  OutputStreamTraits::~OutputStreamTraits(&streamCopier);
  InputStringBufferStream::~InputStringBufferStream(&inputStreamForWrite);
  return;
}

Assistant:

void PDFStream::FlushStreamContentForDirectExtentStream()
{
    mTemporaryStream.pubseekoff(0,std::ios_base::beg);
    
    // copy internal temporary stream to output
    InputStringBufferStream inputStreamForWrite(&mTemporaryStream);
    OutputStreamTraits streamCopier(mOutputStream);
    streamCopier.CopyToOutputStream(&inputStreamForWrite);
    
    mTemporaryStream.str();
    mOutputStream = NULL;
}